

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O0

MPP_RET vdpp2_wait(vdpp2_api_ctx *ctx)

{
  uint uVar1;
  MPP_RET MVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  undefined4 local_38;
  uint local_34;
  MppReqV1 mpp_req;
  MPP_RET ret;
  vdpp2_api_ctx *ctx_local;
  
  if (ctx == (vdpp2_api_ctx *)0x0) {
    _mpp_log_l(2,"vdpp2","found NULL input vdpp ctx %p\n","vdpp2_wait",0);
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    memset(&local_38,0,0x18);
    local_38 = 0x300;
    local_34 = local_34 | 2;
    MVar2 = ioctl(ctx->fd,0x40047601,&local_38);
    mpp_req.data_ptr._4_4_ = MVar2;
    if (MVar2 != MPP_OK) {
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      _mpp_log_l(2,"vdpp2","ioctl POLL_HW_FINISH failed ret %d errno %d %s\n","vdpp2_wait",
                 (ulong)(uint)MVar2,(ulong)uVar1,pcVar5);
    }
    ctx_local._4_4_ = mpp_req.data_ptr._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET vdpp2_wait(struct vdpp2_api_ctx *ctx)
{
    MPP_RET ret;
    MppReqV1 mpp_req;

    if (NULL == ctx) {
        mpp_err_f("found NULL input vdpp ctx %p\n", ctx);
        return MPP_ERR_NULL_PTR;
    }

    memset(&mpp_req, 0, sizeof(mpp_req));
    mpp_req.cmd = MPP_CMD_POLL_HW_FINISH;
    mpp_req.flag |= MPP_FLAGS_LAST_MSG;

    ret = (RK_S32)ioctl(ctx->fd, MPP_IOC_CFG_V1, &mpp_req);
    if (ret) {
        mpp_err_f("ioctl POLL_HW_FINISH failed ret %d errno %d %s\n",
                  ret, errno, strerror(errno));
    }

    return ret;
}